

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3IntFloatCompare(i64 i,double r)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = 1;
  if (((~(ulong)r & 0x7ff0000000000000) != 0 || ((ulong)r & 0xfffffffffffff) == 0) &&
     ((sqlite3Config.bUseLongDouble != '\0' ||
      ((((-9.223372036854776e+18 <= r && (iVar1 = -1, r < 9.223372036854776e+18)) && ((long)r <= i))
       && (iVar1 = 1, i <= (long)r)))))) {
    uVar2 = 0xffffffff;
    if (r <= (double)i) {
      uVar2 = (uint)(r < (double)i);
    }
    return uVar2;
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3IntFloatCompare(i64 i, double r){
  if( sqlite3IsNaN(r) ){
    /* SQLite considers NaN to be a NULL. And all integer values are greater
    ** than NULL */
    return 1;
  }
  if( sqlite3Config.bUseLongDouble ){
    LONGDOUBLE_TYPE x = (LONGDOUBLE_TYPE)i;
    testcase( x<r );
    testcase( x>r );
    testcase( x==r );
    return (x<r) ? -1 : (x>r);
  }else{
    i64 y;
    if( r<-9223372036854775808.0 ) return +1;
    if( r>=9223372036854775808.0 ) return -1;
    y = (i64)r;
    if( i<y ) return -1;
    if( i>y ) return +1;
    testcase( doubleLt(((double)i),r) );
    testcase( doubleLt(r,((double)i)) );
    testcase( doubleEq(r,((double)i)) );
    return (((double)i)<r) ? -1 : (((double)i)>r);
  }
}